

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

int __thiscall google::protobuf::UninterpretedOption::ByteSize(UninterpretedOption *this)

{
  bool bVar1;
  int iVar2;
  uint64 value;
  int64 value_00;
  string *psVar3;
  UninterpretedOption_NamePart *value_01;
  UnknownFieldSet *pUVar4;
  int local_18;
  int local_14;
  int i;
  int total_size;
  UninterpretedOption *this_local;
  
  local_14 = 0;
  if ((this->_has_bits_[0] & 0x1fe) != 0) {
    bVar1 = has_identifier_value(this);
    if (bVar1) {
      psVar3 = identifier_value_abi_cxx11_(this);
      local_14 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = local_14 + 1;
    }
    bVar1 = has_positive_int_value(this);
    if (bVar1) {
      value = positive_int_value(this);
      iVar2 = internal::WireFormatLite::UInt64Size(value);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_negative_int_value(this);
    if (bVar1) {
      value_00 = negative_int_value(this);
      iVar2 = internal::WireFormatLite::Int64Size(value_00);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_double_value(this);
    if (bVar1) {
      local_14 = local_14 + 9;
    }
    bVar1 = has_string_value(this);
    if (bVar1) {
      psVar3 = string_value_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::BytesSize(psVar3);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_aggregate_value(this);
    if (bVar1) {
      psVar3 = aggregate_value_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = iVar2 + 1 + local_14;
    }
  }
  iVar2 = name_size(this);
  local_14 = iVar2 + local_14;
  for (local_18 = 0; iVar2 = name_size(this), local_18 < iVar2; local_18 = local_18 + 1) {
    value_01 = name(this,local_18);
    iVar2 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::UninterpretedOption_NamePart>(value_01);
    local_14 = iVar2 + local_14;
  }
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar4);
    local_14 = iVar2 + local_14;
  }
  this->_cached_size_ = local_14;
  return local_14;
}

Assistant:

int UninterpretedOption::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    // optional string identifier_value = 3;
    if (has_identifier_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->identifier_value());
    }

    // optional uint64 positive_int_value = 4;
    if (has_positive_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt64Size(
          this->positive_int_value());
    }

    // optional int64 negative_int_value = 5;
    if (has_negative_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->negative_int_value());
    }

    // optional double double_value = 6;
    if (has_double_value()) {
      total_size += 1 + 8;
    }

    // optional bytes string_value = 7;
    if (has_string_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this->string_value());
    }

    // optional string aggregate_value = 8;
    if (has_aggregate_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->aggregate_value());
    }

  }
  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  total_size += 1 * this->name_size();
  for (int i = 0; i < this->name_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->name(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}